

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5FreeCursorComponents(Fts5Cursor *pCsr)

{
  Fts5Auxdata *pFVar1;
  Fts5Cursor *in_RDI;
  Fts5Sorter *pSorter;
  int eStmt;
  Fts5Auxdata *pNext;
  Fts5Auxdata *pData;
  Fts5FullTable *pTab;
  int in_stack_ffffffffffffffcc;
  Fts5Storage *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  Fts5Auxdata *local_18;
  
  sqlite3_free((void *)0x26b0c5);
  sqlite3_free((void *)0x26b0d6);
  if (in_RDI->pStmt != (sqlite3_stmt *)0x0) {
    in_stack_ffffffffffffffdc = fts5StmtType(in_RDI);
    sqlite3Fts5StorageStmtRelease
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(sqlite3_stmt *)0x26b10b);
  }
  if (in_RDI->pSorter != (Fts5Sorter *)0x0) {
    sqlite3_finalize((sqlite3_stmt *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    sqlite3_free((void *)0x26b13c);
  }
  if (in_RDI->ePlan != 2) {
    sqlite3Fts5ExprFree((Fts5Expr *)0x26b155);
  }
  local_18 = in_RDI->pAuxdata;
  while (local_18 != (Fts5Auxdata *)0x0) {
    pFVar1 = local_18->pNext;
    if (local_18->xDelete != (_func_void_void_ptr *)0x0) {
      (*local_18->xDelete)(local_18->pPtr);
    }
    sqlite3_free((void *)0x26b1a6);
    local_18 = pFVar1;
  }
  sqlite3_finalize((sqlite3_stmt *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  sqlite3_free((void *)0x26b1d4);
  if ((in_RDI->csrflags & 0x10U) != 0) {
    sqlite3_free((void *)0x26b1f2);
    sqlite3_free((void *)0x26b200);
  }
  sqlite3Fts5IndexCloseReader((Fts5Index *)0x26b20e);
  memset(&in_RDI->ePlan,0,0x98);
  return;
}

Assistant:

static void fts5FreeCursorComponents(Fts5Cursor *pCsr){
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  Fts5Auxdata *pData;
  Fts5Auxdata *pNext;

  sqlite3_free(pCsr->aInstIter);
  sqlite3_free(pCsr->aInst);
  if( pCsr->pStmt ){
    int eStmt = fts5StmtType(pCsr);
    sqlite3Fts5StorageStmtRelease(pTab->pStorage, eStmt, pCsr->pStmt);
  }
  if( pCsr->pSorter ){
    Fts5Sorter *pSorter = pCsr->pSorter;
    sqlite3_finalize(pSorter->pStmt);
    sqlite3_free(pSorter);
  }

  if( pCsr->ePlan!=FTS5_PLAN_SOURCE ){
    sqlite3Fts5ExprFree(pCsr->pExpr);
  }

  for(pData=pCsr->pAuxdata; pData; pData=pNext){
    pNext = pData->pNext;
    if( pData->xDelete ) pData->xDelete(pData->pPtr);
    sqlite3_free(pData);
  }

  sqlite3_finalize(pCsr->pRankArgStmt);
  sqlite3_free(pCsr->apRankArg);

  if( CsrFlagTest(pCsr, FTS5CSR_FREE_ZRANK) ){
    sqlite3_free(pCsr->zRank);
    sqlite3_free(pCsr->zRankArgs);
  }

  sqlite3Fts5IndexCloseReader(pTab->p.pIndex);
  memset(&pCsr->ePlan, 0, sizeof(Fts5Cursor) - ((u8*)&pCsr->ePlan - (u8*)pCsr));
}